

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O2

bool __thiscall bdQuery::proxies(bdQuery *this,list<bdId,_std::allocator<bdId>_> *answer)

{
  int iVar1;
  _List_node_base *p_Var2;
  
  iVar1 = 0;
  p_Var2 = (_List_node_base *)&this->mProxiesFlagged;
  while (p_Var2 = (((_List_base<bdPeer,_std::allocator<bdPeer>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->mProxiesFlagged) {
    std::__cxx11::list<bdId,_std::allocator<bdId>_>::push_back(answer,(value_type *)(p_Var2 + 1));
    iVar1 = iVar1 + -1;
  }
  return iVar1 != 0;
}

Assistant:

bool bdQuery::proxies(std::list<bdId> &answer) {
	/* get all the matches to our query */
    std::list<bdPeer>::iterator it;
	int i = 0;
	for (it = mProxiesFlagged.begin(); it != mProxiesFlagged.end(); it++, i++)
		answer.push_back(it->mPeerId);
	return (i > 0);
}